

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall logger::write_data(logger *this,string *data)

{
  mapped_type *pmVar1;
  string *data_local;
  logger *this_local;
  
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_fstream<char,_std::char_traits<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_fstream<char,_std::char_traits<char>_>_>_>_>
           ::operator[](&this->m_open_files,&this->m_selected_file);
  std::operator<<((ostream *)(pmVar1 + 0x10),(string *)data);
  return;
}

Assistant:

void write_data(const std::string& data) { m_open_files[m_selected_file] << data; }